

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,ArrayPtr<const_char> *params_6,
          ArrayPtr<const_char> *params_7,ArrayPtr<const_char> *params_8)

{
  size_t size;
  char *target;
  initializer_list<unsigned_long> nums;
  undefined8 local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  local_78 = *(undefined8 *)(this + 8);
  local_70 = params->size_;
  local_68 = params_1->size_;
  local_60 = params_2->size_;
  local_58 = params_3->size_;
  local_50 = params_4->size_;
  local_48 = params_5->size_;
  local_40 = params_6->size_;
  local_38 = params_7->size_;
  nums._M_len = (size_type)params_5;
  nums._M_array = (iterator)0x9;
  size = sum((_ *)&local_78,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (target,(ArrayPtr<const_char> *)this,params,params_1,params_2,params_3,params_4,params_5
             ,params_6,params_7);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}